

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hack.c
# Opt level: O0

int weight_cap(void)

{
  schar sVar1;
  schar sVar2;
  boolean bVar3;
  long local_10;
  long carrcap;
  
  sVar1 = acurrstr();
  sVar2 = acurr(4);
  local_10 = (long)(((int)sVar1 + (int)sVar2) * 0x19 + 0x32);
  if (u.umonnum != u.umonster) {
    if ((youmonst.data)->mlet == '\x0e') {
      local_10 = 1000;
    }
    else if ((youmonst.data)->cwt == 0) {
      local_10 = (long)(local_10 * (ulong)(youmonst.data)->msize) / 2;
    }
    else if ((((youmonst.data)->mflags2 & 0x4000000) == 0) ||
            ((((youmonst.data)->mflags2 & 0x4000000) != 0 && (0x5aa < (youmonst.data)->cwt)))) {
      local_10 = (long)(local_10 * (ulong)(youmonst.data)->cwt) / 0x5aa;
    }
  }
  if (((((u.uprops[0x12].intrinsic == 0) && (u.uprops[0x12].extrinsic == 0)) &&
       ((youmonst.data)->mlet != '\x05')) &&
      (bVar3 = on_level(&u.uz,&dungeon_topology.d_air_level), bVar3 == '\0')) &&
     ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags2 & 0x4000000) == 0)))) {
    if (1000 < local_10) {
      local_10 = 1000;
    }
    if (((u.uprops[0x3c].extrinsic == 0) && (((youmonst.data)->mflags1 & 1) == 0)) &&
       ((u.usteed == (monst *)0x0 || (((u.usteed)->data->mflags1 & 1) == 0)))) {
      if ((u.uprops[0x20].extrinsic & 0x20000) != 0) {
        local_10 = local_10 + -100;
      }
      if ((u.uprops[0x20].extrinsic & 0x40000) != 0) {
        local_10 = local_10 + -100;
      }
    }
    if (local_10 < 0) {
      local_10 = 0;
    }
  }
  else {
    local_10._0_4_ = 1000;
  }
  return (int)local_10;
}

Assistant:

int weight_cap(void)
{
	long carrcap;

	carrcap = 25*(ACURRSTR + ACURR(A_CON)) + 50;
	if (Upolyd) {
		/* consistent with can_carry() in mon.c */
		if (youmonst.data->mlet == S_NYMPH)
			carrcap = MAX_CARR_CAP;
		else if (!youmonst.data->cwt)
			carrcap = (carrcap * (long)youmonst.data->msize) / MZ_HUMAN;
		else if (!strongmonst(youmonst.data)
			|| (strongmonst(youmonst.data) && (youmonst.data->cwt > WT_HUMAN)))
			carrcap = (carrcap * (long)youmonst.data->cwt / WT_HUMAN);
	}

	if (Levitation || Is_airlevel(&u.uz)    /* pugh@cornell */
			|| (u.usteed && strongmonst(u.usteed->data)))
		carrcap = MAX_CARR_CAP;
	else {
		if (carrcap > MAX_CARR_CAP) carrcap = MAX_CARR_CAP;
		if (!Flying) {
			if (EWounded_legs & LEFT_SIDE) carrcap -= 100;
			if (EWounded_legs & RIGHT_SIDE) carrcap -= 100;
		}
		if (carrcap < 0) carrcap = 0;
	}
	return (int) carrcap;
}